

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void build_paths_internal(ZNode *z,VecVecZNode *paths,int parent,int n,int n_to_go)

{
  uint uVar1;
  ZNode **ppZVar2;
  VecZNode *pVVar3;
  int local_30;
  uint local_2c;
  uint l;
  uint k;
  uint j;
  int n_to_go_local;
  int n_local;
  int parent_local;
  VecVecZNode *paths_local;
  ZNode *z_local;
  
  if (paths->v[parent]->v == (ZNode **)0x0) {
    pVVar3 = paths->v[parent];
    paths->v[parent]->v = pVVar3->e;
    uVar1 = paths->v[parent]->n;
    paths->v[parent]->n = uVar1 + 1;
    pVVar3->e[uVar1] = z;
  }
  else {
    if (paths->v[parent]->v == paths->v[parent]->e) {
      if (paths->v[parent]->n < 3) {
        ppZVar2 = paths->v[parent]->v;
        uVar1 = paths->v[parent]->n;
        paths->v[parent]->n = uVar1 + 1;
        ppZVar2[uVar1] = z;
        goto LAB_001573b2;
      }
    }
    else if ((paths->v[parent]->n & 7) != 0) {
      ppZVar2 = paths->v[parent]->v;
      uVar1 = paths->v[parent]->n;
      paths->v[parent]->n = uVar1 + 1;
      ppZVar2[uVar1] = z;
      goto LAB_001573b2;
    }
    vec_add_internal(paths->v[parent],z);
  }
LAB_001573b2:
  if (1 < n_to_go) {
    n_to_go_local = parent;
    for (local_2c = 0; local_2c < (z->sns).n; local_2c = local_2c + 1) {
      local_30 = 0;
      for (l = 0; l < ((z->sns).v[local_2c]->zns).n; l = l + 1) {
        if (((z->sns).v[local_2c]->zns).v[l] != (ZNode *)0x0) {
          if (local_2c + local_30 != 0) {
            if (paths->v == (VecZNode **)0x0) {
              pVVar3 = new_VecZNode(paths,n - (n_to_go + -1),n_to_go_local);
              paths->v = paths->e;
              uVar1 = paths->n;
              paths->n = uVar1 + 1;
              paths->e[uVar1] = pVVar3;
            }
            else if (paths->v == paths->e) {
              if (paths->n < 3) {
                pVVar3 = new_VecZNode(paths,n - (n_to_go + -1),n_to_go_local);
                uVar1 = paths->n;
                paths->n = uVar1 + 1;
                paths->v[uVar1] = pVVar3;
              }
              else {
LAB_00157520:
                pVVar3 = new_VecZNode(paths,n - (n_to_go + -1),n_to_go_local);
                vec_add_internal(paths,pVVar3);
              }
            }
            else {
              if ((paths->n & 7) == 0) goto LAB_00157520;
              pVVar3 = new_VecZNode(paths,n - (n_to_go + -1),n_to_go_local);
              uVar1 = paths->n;
              paths->n = uVar1 + 1;
              paths->v[uVar1] = pVVar3;
            }
            n_to_go_local = paths->n - 1;
          }
          build_paths_internal(((z->sns).v[local_2c]->zns).v[l],paths,n_to_go_local,n,n_to_go + -1);
          local_30 = local_30 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void build_paths_internal(ZNode *z, VecVecZNode *paths, int parent, int n, int n_to_go) {
  uint j, k, l;

  vec_add(paths->v[parent], z);
  if (n_to_go <= 1) return;
  for (k = 0; k < z->sns.n; k++)
    for (j = 0, l = 0; j < z->sns.v[k]->zns.n; j++) {
      if (z->sns.v[k]->zns.v[j]) {
        if (k + l) {
          vec_add(paths, new_VecZNode(paths, n - (n_to_go - 1), parent));
          parent = paths->n - 1;
        }
        build_paths_internal(z->sns.v[k]->zns.v[j], paths, parent, n, n_to_go - 1);
        l++;
      }
    }
}